

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O0

bool __thiscall RTIMUGD20M303DLHC::setGyroSampleRate(RTIMUGD20M303DLHC *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte local_19;
  uchar ctrl1;
  RTIMUGD20M303DLHC *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_GD20M303DLHCGyroSampleRate) {
  case 0:
    local_19 = 0xf;
    (this->super_RTIMU).m_sampleRate = 0x5f;
    break;
  case 1:
    local_19 = 0x4f;
    (this->super_RTIMU).m_sampleRate = 0xbe;
    break;
  case 2:
    local_19 = 0x8f;
    (this->super_RTIMU).m_sampleRate = 0x17c;
    break;
  case 3:
    local_19 = 0xcf;
    (this->super_RTIMU).m_sampleRate = 0x2f8;
    break;
  default:
    fprintf(_stderr,"Illegal L3GD20 sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20M303DLHCGyroSampleRate);
    return false;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->super_RTIMU).m_sampleRate;
  (this->super_RTIMU).m_sampleInterval = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar1,0);
  switch(((this->super_RTIMU).m_settings)->m_GD20M303DLHCGyroBW) {
  case 0:
    break;
  case 1:
    local_19 = local_19 | 0x10;
    break;
  case 2:
    local_19 = local_19 | 0x20;
    break;
  case 3:
    local_19 = local_19 | 0x30;
  }
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr
                             ,' ',local_19,"Failed to set L3GD20 CTRL1");
  return bVar2;
}

Assistant:

bool RTIMUGD20M303DLHC::setGyroSampleRate()
{
    unsigned char ctrl1;

    switch (m_settings->m_GD20M303DLHCGyroSampleRate) {
    case L3GD20_SAMPLERATE_95:
        ctrl1 = 0x0f;
        m_sampleRate = 95;
        break;

    case L3GD20_SAMPLERATE_190:
        ctrl1 = 0x4f;
        m_sampleRate = 190;
        break;

    case L3GD20_SAMPLERATE_380:
        ctrl1 = 0x8f;
        m_sampleRate = 380;
        break;

    case L3GD20_SAMPLERATE_760:
        ctrl1 = 0xcf;
        m_sampleRate = 760;
        break;

    default:
        HAL_ERROR1("Illegal L3GD20 sample rate code %d\n", m_settings->m_GD20M303DLHCGyroSampleRate);
        return false;
    }

    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;

    switch (m_settings->m_GD20M303DLHCGyroBW) {
    case L3GD20_BANDWIDTH_0:
        ctrl1 |= 0x00;
        break;

    case L3GD20_BANDWIDTH_1:
        ctrl1 |= 0x10;
        break;

    case L3GD20_BANDWIDTH_2:
        ctrl1 |= 0x20;
        break;

    case L3GD20_BANDWIDTH_3:
        ctrl1 |= 0x30;
        break;

    }

    return (m_settings->HALWrite(m_gyroSlaveAddr, L3GD20_CTRL1, ctrl1, "Failed to set L3GD20 CTRL1"));
}